

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  ImVector<ImDrawChannel> *this_00;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  value_type *ppvVar8;
  int i;
  int i_00;
  ImDrawCmd draw_cmd;
  
  if ((this->_ChannelsCurrent == 0) && (this->_ChannelsCount == 1)) {
    this_00 = &this->_Channels;
    iVar1 = (this->_Channels).Size;
    if (iVar1 < channels_count) {
      ImVector<ImDrawChannel>::resize(this_00,channels_count);
    }
    this->_ChannelsCount = channels_count;
    pvVar6 = ImVector<ImDrawChannel>::operator[](this_00,0);
    (pvVar6->CmdBuffer).Size = 0;
    (pvVar6->CmdBuffer).Capacity = 0;
    (pvVar6->CmdBuffer).Data = (ImDrawCmd *)0x0;
    (pvVar6->IdxBuffer).Size = 0;
    (pvVar6->IdxBuffer).Capacity = 0;
    (pvVar6->IdxBuffer).Data = (unsigned_short *)0x0;
    for (i_00 = 1; i_00 < channels_count; i_00 = i_00 + 1) {
      pvVar6 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      if (i_00 < iVar1) {
        ImVector<ImDrawCmd>::resize(&pvVar6->CmdBuffer,0);
        pvVar6 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
        ImVector<unsigned_short>::resize(&pvVar6->IdxBuffer,0);
      }
      else {
        (pvVar6->IdxBuffer).Size = 0;
        (pvVar6->IdxBuffer).Capacity = 0;
        (pvVar6->IdxBuffer).Data = (unsigned_short *)0x0;
        (pvVar6->CmdBuffer).Size = 0;
        (pvVar6->CmdBuffer).Capacity = 0;
        (pvVar6->CmdBuffer).Data = (ImDrawCmd *)0x0;
      }
      pvVar6 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      if ((pvVar6->CmdBuffer).Size == 0) {
        draw_cmd.ElemCount = 0;
        draw_cmd.ClipRect.x = 0.0;
        draw_cmd.ClipRect.y = 0.0;
        draw_cmd.ClipRect.z = 0.0;
        draw_cmd.ClipRect.w = 0.0;
        draw_cmd.TextureId = (ImTextureID)0x0;
        draw_cmd.UserCallback = (ImDrawCallback)0x0;
        draw_cmd.UserCallbackData = (void *)0x0;
        pvVar7 = ImVector<ImVec4>::back(&this->_ClipRectStack);
        uVar2 = pvVar7->x;
        uVar3 = pvVar7->y;
        uVar4 = pvVar7->z;
        uVar5 = pvVar7->w;
        draw_cmd.ClipRect.x = (float)uVar2;
        draw_cmd.ClipRect.y = (float)uVar3;
        draw_cmd.ClipRect.z = (float)uVar4;
        draw_cmd.ClipRect.w = (float)uVar5;
        ppvVar8 = ImVector<void_*>::back(&this->_TextureIdStack);
        draw_cmd.TextureId = *ppvVar8;
        pvVar6 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
        ImVector<ImDrawCmd>::push_back(&pvVar6->CmdBuffer,&draw_cmd);
      }
    }
    return;
  }
  __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x1eb,"void ImDrawList::ChannelsSplit(int)");
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}